

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_string_in_fixed_set.c
# Opt level: O2

int IsMatchUnchecked(uchar matcher,char *key,char *multibyte_start)

{
  bool bVar1;
  
  if (multibyte_start == (char *)0x0) {
    if ((byte)*key < 0xc0) {
      bVar1 = *key == matcher;
    }
    else {
      bVar1 = matcher == '\x1f';
    }
  }
  else if (multibyte_start == key) {
    bVar1 = false;
  }
  else {
    bVar1 = (byte)(matcher ^ *key) == 0xc0;
  }
  return (int)bVar1;
}

Assistant:

static int IsMatchUnchecked(const unsigned char matcher,
	const char* key,
	const char* multibyte_start)
{
	if (multibyte_start) {
		/* Multibyte matching mode. */
		if (multibyte_start == key) {
			/* Match leading byte, which will also match the sequence length. */
			return (matcher ^ 0x80) == (const unsigned char)*key;
		} else {
			/* Match following bytes. */
			return (matcher ^ 0xC0) == (const unsigned char)*key;
		}
	}
	/* If key points at a leading byte in a multibyte sequence, but we are not yet
	 * in multibyte mode, then the dafsa should contain a special byte to indicate
	 * a mode switch. */
	if (GetMultibyteLength(*key)) {
		return matcher == 0x1F;
	}
	/* Normal matching of a single byte character. */
	return matcher == (const unsigned char)*key;
}